

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_builder.h
# Opt level: O0

void BuilderReuseTests<flatbuffers::FlatBufferBuilderImpl<false>,_flatbuffers::FlatBufferBuilderImpl<false>_>
     ::builder_reusable_after_release_test(TestSelector *selector)

{
  Color CVar1;
  int iVar2;
  size_type sVar3;
  size_t buffer_minalign;
  reference ctx;
  char *tbs;
  string local_118 [32];
  DetachedBuffer local_f8;
  offset_type local_c8;
  offset_type local_b8;
  int local_b4;
  Offset<MyGame::Example::Monster> root_offset1;
  int i;
  vector<flatbuffers::DetachedBuffer,_std::allocator<flatbuffers::DetachedBuffer>_> buffers;
  FlatBufferBuilderImpl<false> fbb;
  TestSelector *selector_local;
  
  fbb.string_pool._4_4_ = 1;
  sVar3 = std::
          set<BuilderReuseTestSelector,_std::less<BuilderReuseTestSelector>,_std::allocator<BuilderReuseTestSelector>_>
          ::count(selector,(key_type *)((long)&fbb.string_pool + 4));
  if (sVar3 != 0) {
    buffer_minalign = flatbuffers::AlignOf<unsigned_long>();
    tbs = (char *)0x0;
    flatbuffers::FlatBufferBuilderImpl<false>::FlatBufferBuilderImpl
              ((FlatBufferBuilderImpl<false> *)
               &buffers.
                super__Vector_base<flatbuffers::DetachedBuffer,_std::allocator<flatbuffers::DetachedBuffer>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,0x400,(Allocator *)0x0,false,
               buffer_minalign);
    std::vector<flatbuffers::DetachedBuffer,_std::allocator<flatbuffers::DetachedBuffer>_>::vector
              ((vector<flatbuffers::DetachedBuffer,_std::allocator<flatbuffers::DetachedBuffer>_> *)
               &root_offset1);
    for (local_b4 = 0; local_b4 < 5; local_b4 = local_b4 + 1) {
      local_c8 = (offset_type)
                 populate1((FlatBufferBuilder *)
                           &buffers.
                            super__Vector_base<flatbuffers::DetachedBuffer,_std::allocator<flatbuffers::DetachedBuffer>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
      local_b8 = local_c8;
      flatbuffers::FlatBufferBuilderImpl<false>::Finish<MyGame::Example::Monster>
                ((FlatBufferBuilderImpl<false> *)
                 &buffers.
                  super__Vector_base<flatbuffers::DetachedBuffer,_std::allocator<flatbuffers::DetachedBuffer>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (Offset<MyGame::Example::Monster>)local_c8,(char *)0x0);
      flatbuffers::FlatBufferBuilderImpl<false>::Release
                (&local_f8,
                 (FlatBufferBuilderImpl<false> *)
                 &buffers.
                  super__Vector_base<flatbuffers::DetachedBuffer,_std::allocator<flatbuffers::DetachedBuffer>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::vector<flatbuffers::DetachedBuffer,_std::allocator<flatbuffers::DetachedBuffer>_>::
      push_back((vector<flatbuffers::DetachedBuffer,_std::allocator<flatbuffers::DetachedBuffer>_> *
                )&root_offset1,&local_f8);
      flatbuffers::DetachedBuffer::~DetachedBuffer(&local_f8);
      ctx = std::vector<flatbuffers::DetachedBuffer,_std::allocator<flatbuffers::DetachedBuffer>_>::
            operator[]((vector<flatbuffers::DetachedBuffer,_std::allocator<flatbuffers::DetachedBuffer>_>
                        *)&root_offset1,(long)local_b4);
      m1_name_abi_cxx11_();
      CVar1 = m1_color();
      iVar2 = verify((EVP_PKEY_CTX *)ctx,(uchar *)local_118,(ulong)CVar1,(uchar *)tbs,
                     buffer_minalign);
      tbs = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/test_builder.h";
      buffer_minalign = 0xef;
      TestEq<bool,bool>(true,(bool)((byte)iVar2 & 1),
                        "\'true\' != \'verify(buffers[i], m1_name(), m1_color())\'",
                        "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/test_builder.h"
                        ,0xef,
                        "static void BuilderReuseTests<flatbuffers::FlatBufferBuilderImpl<>, flatbuffers::FlatBufferBuilderImpl<>>::builder_reusable_after_release_test(TestSelector) [DestBuilder = flatbuffers::FlatBufferBuilderImpl<>, SrcBuilder = flatbuffers::FlatBufferBuilderImpl<>]"
                       );
      std::__cxx11::string::~string(local_118);
    }
    std::vector<flatbuffers::DetachedBuffer,_std::allocator<flatbuffers::DetachedBuffer>_>::~vector
              ((vector<flatbuffers::DetachedBuffer,_std::allocator<flatbuffers::DetachedBuffer>_> *)
               &root_offset1);
    flatbuffers::FlatBufferBuilderImpl<false>::~FlatBufferBuilderImpl
              ((FlatBufferBuilderImpl<false> *)
               &buffers.
                super__Vector_base<flatbuffers::DetachedBuffer,_std::allocator<flatbuffers::DetachedBuffer>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  return;
}

Assistant:

static void builder_reusable_after_release_test(TestSelector selector) {
    if (!selector.count(REUSABLE_AFTER_RELEASE)) { return; }

    DestBuilder fbb;
    std::vector<flatbuffers::DetachedBuffer> buffers;
    for (int i = 0; i < 5; ++i) {
      auto root_offset1 = populate1(fbb);
      fbb.Finish(root_offset1);
      buffers.push_back(fbb.Release());
      TEST_ASSERT_FUNC(verify(buffers[i], m1_name(), m1_color()));
    }
  }